

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O1

Vector __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::measureDynamics
          (StableIMUFixedContactDynamicalSystem *this,Vector *x,Vector *u,TimeIndex k)

{
  double *__dest;
  Index *this_00;
  double dVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar7;
  undefined8 uVar8;
  _func_int *p_Var9;
  char cVar10;
  PointerType ptr;
  long lVar11;
  double *pdVar12;
  NoiseBase *pNVar13;
  Index IVar14;
  undefined8 *puVar15;
  char *__function;
  ulong uVar16;
  Index extraout_RDX;
  ulong uVar17;
  NoiseBase *pNVar18;
  ulong uVar19;
  NoiseBase *pNVar20;
  ulong uVar21;
  uint uVar22;
  TimeIndex in_R8;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  Vector VVar31;
  Vector *y;
  Vector v;
  Vector3 acceleration;
  Matrix3 rFlex;
  Vector3 positionFlex;
  Vector3 accelerationControl;
  Vector3 velocityControl;
  Vector3 positionControl;
  Vector3 orientationFlexV;
  Vector3 accelerationFlex;
  Vector3 angularVelocity;
  Vector3 orientationControlV;
  Quaternion qControl;
  Quaternion qFlex;
  Matrix<double,_3,_3,_0,_3,_3> local_488;
  double local_438 [5];
  double dStack_410;
  double local_408;
  double dStack_400;
  undefined1 local_3f8 [16];
  double local_3e8;
  double dStack_3e0;
  Matrix<double,_3,_3,_0,_3,_3> local_3d8;
  double local_388 [4];
  undefined1 local_368 [16];
  undefined8 local_358;
  double local_350;
  double dStack_348;
  double local_340;
  undefined8 local_338;
  undefined1 local_328 [40];
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  Matrix<double,_3,_1,_0,_3,_1> local_298;
  Matrix<double,_3,_1,_0,_3,_1> local_278;
  Vector3 local_258;
  double local_238;
  double dStack_230;
  double local_228;
  undefined1 local_220 [24];
  Matrix<double,_3,_3,_0,_3,_3> *local_208 [2];
  double local_1f8;
  Matrix<double,_3,_3,_0,_3,_3> *local_1f0;
  Matrix<double,_3,_1,_0,_3,_1> *local_1e8;
  Index local_1d0;
  Matrix<double,_3,_3,_0,_3,_3> *local_1c8;
  Matrix<double,_3,_3,_0,_3,_3> *local_1b8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1b0;
  double *local_1a0;
  Matrix<double,_3,_3,_0,_3,_3> *local_190;
  double *local_188;
  double local_178;
  Data DStack_170;
  double *local_128;
  Vector3 local_118;
  Matrix<double,_3,_3,_0,_3,_3> local_100;
  Quaternion local_b8;
  Quaternion local_98;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  cVar10 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,u);
  if (cVar10 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  lVar11 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (2 < lVar11) {
    pdVar12 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_328._0_8_ = *pdVar12;
    local_328._8_8_ = pdVar12[1];
    local_328._16_8_ = pdVar12[2];
    if ((8 < lVar11) && (0xe < lVar11)) {
      local_238 = pdVar12[0xc];
      dStack_230 = pdVar12[0xd];
      local_228 = pdVar12[0xe];
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = pdVar12[3];
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = pdVar12[4];
      local_258.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = pdVar12[5];
      if (0x11 < lVar11) {
        local_388[0] = pdVar12[9];
        local_388[1] = pdVar12[10];
        dVar1 = pdVar12[0xb];
        local_2c8 = pdVar12[0xf];
        dStack_2c0 = pdVar12[0x10];
        local_2d8 = pdVar12[0x11];
        uStack_2d0 = 0;
        computeQuaternion_(&local_98,(StableIMUFixedContactDynamicalSystem *)x,&local_258);
        dVar4 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[1] +
                local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[1];
        dVar6 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2] +
                local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
        dVar28 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[0] *
                 (local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[0] +
                 local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[0]);
        local_3f8._8_8_ = 0;
        local_3f8._0_8_ =
             local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[3];
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = (local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                    m_storage.m_data.array[0] +
                   local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0]) *
                   local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[3];
        local_3e8 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                    m_storage.m_data.array[0];
        dStack_3e0 = 0.0;
        local_438[4] = local_98.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[1];
        dStack_410 = 0.0;
        local_408 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                    m_storage.m_data.array[2];
        dStack_400 = 0.0;
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = 1.0 - (dVar4 * local_98.m_coeffs.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[1] +
                         dVar6 * local_98.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[2]);
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0] * dVar4 -
                   dVar6 * local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3];
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0] * dVar6 +
                   dVar4 * local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3];
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0] * dVar4 +
                   dVar6 * local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3];
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = 1.0 - (dVar6 * local_98.m_coeffs.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[2] + dVar28);
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[1] * dVar6 -
                   local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5];
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0] * dVar6 -
                   dVar4 * local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3];
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[1] * dVar6 +
                   local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[5];
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = 1.0 - (dVar4 * local_98.m_coeffs.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[1] + dVar28);
        cVar10 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[9])(x,k);
        if (cVar10 == '\0') {
          __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                        ,0x45,
                        "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                       );
        }
        lVar11 = *(long *)(k + 8);
        if (2 < lVar11) {
          pdVar12 = *(double **)k;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = *pdVar12;
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = pdVar12[1];
          local_278.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = pdVar12[2];
          if (8 < lVar11) {
            local_298.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = pdVar12[6];
            local_298.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar12[7];
            local_298.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = pdVar12[8];
            if (0xe < lVar11) {
              local_2b8 = pdVar12[0xc];
              dStack_2b0 = pdVar12[0xd];
              local_2a8 = pdVar12[0xe];
              local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = pdVar12[3];
              local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = pdVar12[4];
              local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = pdVar12[5];
              local_2f8 = pdVar12[9];
              dStack_2f0 = pdVar12[10];
              local_2e8 = pdVar12[0xb];
              uStack_2e0 = 0;
              computeQuaternion_(&local_b8,(StableIMUFixedContactDynamicalSystem *)x,&local_118);
              dVar6 = local_438[4];
              dVar4 = local_3f8._0_8_;
              dStack_410 = local_438[4] *
                           local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3];
              local_438[4] = local_438[4] *
                             local_b8.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[2];
              dVar28 = local_408 *
                       local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[0] -
                       local_3e8 *
                       local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[2];
              auVar27._8_4_ = SUB84(dVar28,0);
              auVar27._0_8_ =
                   local_408 *
                   local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[1] -
                   local_3e8 *
                   local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[3];
              auVar27._12_4_ = (int)((ulong)dVar28 >> 0x20);
              stack0xfffffffffffffcf8 = auVar27 ^ _DAT_00199020;
              auVar5._8_4_ = local_3f8._0_4_;
              auVar5._0_8_ = dVar4;
              auVar5._12_4_ = local_3f8._4_4_;
              local_3f8 = auVar5;
              dVar29 = local_408 *
                       local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[2];
              dVar30 = local_408 *
                       local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[3];
              local_408 = local_b8.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[0];
              dStack_400 = local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
              dVar28 = local_3e8 *
                       local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[1];
              local_3e8 = -(local_3e8 *
                            local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[0] + dVar29) +
                          (dVar4 * local_b8.m_coeffs.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data.array[3] -
                          dVar6 * local_b8.m_coeffs.
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[1]);
              dStack_3e0 = dVar28 + dVar30 +
                           (dVar4 * local_b8.m_coeffs.
                                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                    m_storage.m_data.array[2] -
                           dVar6 * local_b8.m_coeffs.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data.array[0]);
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] = -local_2c8;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] = 0.0;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] = local_2d8;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] = -dStack_2c0;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3] = -local_2d8;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] = 0.0;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] = local_2c8;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] = dStack_2c0;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] = 0.0;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[3] = -dVar1;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[2] = -local_388[1];
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[7] = -local_388[0];
              local_388[2] = 0.0;
              local_388[3] = dVar1;
              local_368._8_4_ = SUB84(dVar1,0);
              local_368._0_8_ =
                   local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2];
              local_368._12_4_ =
                   (int)((ulong)local_78.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3] >> 0x20);
              auVar5 = local_368;
              local_358 = 0;
              local_350 = local_388[0];
              dStack_348 = local_388[1];
              local_340 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[7];
              local_338 = 0;
              lVar11 = 0x10;
              do {
                dVar4 = *(double *)((long)local_388 + lVar11);
                dVar6 = *(double *)((long)local_388 + lVar11 + 8);
                dVar28 = *(double *)((long)local_388 + lVar11 + 0x10);
                *(double *)
                 ((long)local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + lVar11 + 8) =
                     dVar28 * local_388[1] + dVar6 * (double)local_368._8_8_ + dVar4 * 0.0;
                *(double *)
                 ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar11 + -8) =
                     dVar28 * local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[7] + dVar6 * 0.0 + dVar4 * dVar1;
                *(double *)
                 ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar11) =
                     (dVar28 * 0.0 + local_388[0] * dVar6) - dVar4 * local_388[1];
                lVar11 = lVar11 + 0x18;
              } while (lVar11 != 0x58);
              local_1c8 = &local_78;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[0] = 0.0;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[4] = 0.0;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[5] = local_388[0];
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[6] = local_388[1];
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[8] = 0.0;
              local_208[0] = &local_488;
              local_208[1] = &local_100;
              local_1f0 = &local_3d8;
              local_1e8 = &local_278;
              local_1d0 = 0x4000000000000000;
              local_1b0 = &local_298;
              local_1a0 = &local_238;
              local_188 = &local_2b8;
              local_368 = auVar5;
              local_1b8 = local_1f0;
              local_190 = local_1f0;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[1] = dVar1;
              Eigen::internal::
              binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              ::Data::Data(&DStack_170,(XprType *)(local_220 + 0x10));
              local_128 = local_1a0;
              dVar4 = *local_188;
              dVar6 = local_188[1];
              dVar28 = local_188[2];
              local_438[0] = dVar28 * (local_190->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array[6] +
                             dVar6 * (local_190->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                     m_storage.m_data.array[3] +
                             (local_190->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[0] * dVar4 +
                             *local_1a0 +
                             *(double *)
                              DStack_170.rhsImpl.
                              super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                              .
                              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                              .super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              .m_d.data +
                             *(double *)
                              DStack_170.lhsImpl.
                              super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                              .
                              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                              .super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              .m_d.data;
              local_438[1] = dVar28 * (local_190->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array[7] +
                             dVar6 * (local_190->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                     m_storage.m_data.array[4] +
                             (local_190->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array[1] * dVar4 +
                             local_1a0[1] +
                             *(double *)
                              ((long)DStack_170.rhsImpl.
                                     super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                                     .
                                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                     .super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     .m_d.data + 8) +
                             *(double *)
                              ((long)DStack_170.lhsImpl.
                                     super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                                     .
                                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                     .super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     .m_d.data + 8);
              local_438[2] = dVar28 * (local_190->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array[8] +
                             dVar6 * (local_190->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                     m_storage.m_data.array[5] +
                             dVar4 * (local_190->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                     m_storage.m_data.array[2] +
                             *(double *)
                              ((long)DStack_170.lhsImpl.
                                     super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                                     .
                                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                     .super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     .m_d.data + 0x10) +
                             *(double *)
                              ((long)DStack_170.rhsImpl.
                                     super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                                     .
                                     super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                     .super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     .m_d.data + 0x10) + local_1a0[2];
              local_178 = local_2e8 *
                          local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[6] +
                          dStack_2f0 *
                          local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[3] +
                          local_2f8 *
                          local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[0] + local_388[0];
              DStack_170._0_8_ =
                   local_2e8 *
                   local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[7] +
                   dStack_2f0 *
                   local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] +
                   local_2f8 *
                   local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1] + local_388[1];
              DStack_170.lhsImpl.
              super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              .
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>.m_d.
              data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)
                     (plainobjectbase_evaluator_data<double,_0>)
                     (local_2e8 *
                      local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8] +
                      local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[5] * dStack_2f0 +
                      local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2] * local_2f8 + dVar1);
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] = 0.0;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] = 0.0;
              free((void *)0x0);
              pdVar12 = (double *)malloc(0x50);
              if (((ulong)pdVar12 & 0xf) != 0) {
                __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                              "void *Eigen::internal::aligned_malloc(std::size_t)");
              }
              if (pdVar12 == (double *)0x0) {
                puVar15 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar15 = operator_delete;
                __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] = 4.94065645841247e-323;
              pdVar12[8] = 0.0;
              pdVar12[9] = 0.0;
              pdVar12[6] = 0.0;
              pdVar12[7] = 0.0;
              pdVar12[4] = 0.0;
              pdVar12[5] = 0.0;
              *pdVar12 = (double)local_3f8._0_8_ * local_408 + local_438[4] +
                         (double)local_328._32_8_;
              pdVar12[1] = (double)local_3f8._8_8_ * dStack_400 + dStack_410 + dStack_300;
              pdVar12[2] = dStack_3e0;
              pdVar12[3] = local_3e8;
              __dest = pdVar12 + 4;
              uVar17 = 3;
              if (((ulong)__dest & 7) == 0) {
                uVar17 = (ulong)((uint)((ulong)__dest >> 3) & 1);
              }
              uVar25 = (uint)(uVar17 ^ 3);
              iVar24 = (int)uVar17;
              local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] = (double)pdVar12;
              if (uVar17 != 0) {
                memcpy(__dest,local_438,(ulong)(uint)(iVar24 * 8));
              }
              if (1 < uVar25) {
                uVar16 = (ulong)(uint)(iVar24 * 8);
                uVar8 = *(undefined8 *)((long)local_438 + uVar16 + 8);
                puVar15 = (undefined8 *)((long)pdVar12 + uVar16 + 0x20);
                *puVar15 = *(undefined8 *)((long)local_438 + uVar16);
                puVar15[1] = uVar8;
              }
              if ((uVar25 & 0xfffffffe) + iVar24 < 3) {
                uVar16 = (ulong)((iVar24 + (uVar25 & 0xfffffffe)) * 8);
                memcpy((void *)((long)pdVar12 + uVar16 + 0x20),(void *)((long)local_438 + uVar16),
                       ((uVar17 ^ 3) - (ulong)(uVar25 & 0xfffffffe)) * 8);
              }
              dVar4 = local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1];
              dVar1 = local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0];
              if (2 < (long)local_488.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array[1]) {
                pdVar12 = (double *)
                          ((long)local_488.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[0] +
                          ((long)local_488.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[1] + -3) * 8);
                uVar17 = 3;
                if (((ulong)pdVar12 & 7) == 0) {
                  uVar17 = (ulong)((uint)((ulong)pdVar12 >> 3) & 1);
                }
                uVar25 = (uint)(uVar17 ^ 3);
                if (uVar17 != 0) {
                  memcpy(pdVar12,&local_178,(ulong)(uint)((int)uVar17 * 8));
                }
                if (1 < uVar25) {
                  dVar6 = *(double *)
                           ((long)&DStack_170.lhsImpl.
                                   super_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                                   .
                                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                   .m_result.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage + uVar17 * 8 + -0x10);
                  pdVar12 = (double *)((long)dVar1 + ((long)dVar4 + uVar17 + -3) * 8);
                  *pdVar12 = (&local_178)[uVar17];
                  pdVar12[1] = dVar6;
                }
                if ((uVar25 & 0xfffffffe) + (int)uVar17 < 3) {
                  lVar11 = uVar17 + (uVar25 & 0xfffffffe);
                  memcpy((double *)((long)dVar1 + ((long)dVar4 + lVar11 + -3) * 8),
                         &local_178 + lVar11,((uVar17 ^ 3) - (ulong)(uVar25 & 0xfffffffe)) * 8);
                }
                this_00 = &(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows;
                AlgebraicSensor::setState((AlgebraicSensor *)this_00,(Vector *)&local_488,in_R8);
                pp_Var2 = (_func_int **)
                          x[0x16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
                if ((long)pp_Var2 < 0) {
                  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                               );
                }
                (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                     (_func_int **)0x0;
                (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                     (_func_int **)0x0;
                if ((this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase !=
                    pp_Var2) {
                  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                            ((DenseStorage<double,__1,__1,_1,_0> *)this,(Index)pp_Var2,
                             (Index)pp_Var2,1);
                }
                pp_Var3 = (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase;
                if (pp_Var3 != pp_Var2) {
                  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
                               );
                }
                pp_Var2 = (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase;
                uVar17 = (long)pp_Var3 - ((long)pp_Var3 >> 0x3f) & 0xfffffffffffffffe;
                if (1 < (long)pp_Var3) {
                  uVar16 = 2;
                  if (2 < (long)uVar17) {
                    uVar16 = uVar17;
                  }
                  memset(pp_Var2,0,uVar16 * 8);
                }
                if ((long)uVar17 < (long)pp_Var3) {
                  memset(pp_Var2 + ((long)pp_Var3 / 2) * 2,0,
                         (long)pp_Var3 * 8 + ((long)pp_Var3 / 2) * -0x10);
                }
                AlgebraicSensor::getMeasurements((AlgebraicSensor *)local_220,SUB81(this_00,0));
                pNVar13 = (NoiseBase *)
                          AlgebraicSensor::getMeasurementSize((AlgebraicSensor *)this_00);
                pp_Var2 = (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase;
                if ((long)pNVar13 < 0 && pp_Var2 != (_func_int **)0x0) {
                  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                                "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                               );
                }
                if ((-1 < (long)pNVar13) &&
                   ((long)pNVar13 <=
                    (long)(this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase))
                {
                  if (pNVar13 != (NoiseBase *)local_220._8_8_) {
                    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                                  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                                 );
                  }
                  pNVar18 = pNVar13;
                  if ((((ulong)pp_Var2 & 7) == 0) &&
                     (pNVar18 = (NoiseBase *)(ulong)((uint)((ulong)pp_Var2 >> 3) & 1),
                     (long)pNVar13 <= (long)pNVar18)) {
                    pNVar18 = pNVar13;
                  }
                  lVar11 = (long)pNVar13 - (long)pNVar18;
                  if (0 < (long)pNVar18) {
                    pNVar20 = (NoiseBase *)0x0;
                    do {
                      pp_Var2[(long)pNVar20] = *(_func_int **)(local_220._0_8_ + pNVar20 * 8);
                      pNVar20 = (NoiseBase *)((long)&pNVar20->_vptr_NoiseBase + 1);
                    } while (pNVar18 != pNVar20);
                  }
                  pNVar20 = (NoiseBase *)
                            ((long)&pNVar18->_vptr_NoiseBase +
                            (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU));
                  if (1 < lVar11) {
                    do {
                      p_Var9 = ((_func_int **)(local_220._0_8_ + pNVar18 * 8))[1];
                      pp_Var2[(long)pNVar18] = *(_func_int **)(local_220._0_8_ + pNVar18 * 8);
                      (pp_Var2 + (long)pNVar18)[1] = p_Var9;
                      pNVar18 = (NoiseBase *)((long)&pNVar18->_vptr_NoiseBase + 2);
                    } while ((long)pNVar18 < (long)pNVar20);
                  }
                  if ((long)pNVar20 < (long)pNVar13) {
                    do {
                      pp_Var2[(long)pNVar20] = *(_func_int **)(local_220._0_8_ + pNVar20 * 8);
                      pNVar20 = (NoiseBase *)((long)&pNVar20->_vptr_NoiseBase + 1);
                    } while (pNVar13 != pNVar20);
                  }
                  free((void *)local_220._0_8_);
                  pdVar12 = x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data;
                  if ((double *)
                      x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows != pdVar12) {
                    uVar25 = 0;
                    uVar17 = 0;
                    do {
                      IVar14 = AlgebraicSensor::getMeasurementSize((AlgebraicSensor *)this_00);
                      lVar11 = (ulong)(uint)((int)uVar17 * 3) + IVar14;
                      if ((lVar11 < 0) ||
                         ((long)(this->sensor_).super_AlgebraicSensor.super_SensorBase.
                                _vptr_SensorBase + -3 < lVar11)) goto LAB_0015578b;
                      uVar26 = (ulong)uVar25;
                      local_1e8 = (Matrix<double,_3,_1,_0,_3,_1> *)(pdVar12 + uVar17 * 3);
                      local_220._16_8_ = local_208;
                      dVar1 = (local_1e8->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array[0];
                      dVar4 = (local_1e8->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array[1];
                      dVar6 = (local_1e8->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array[2];
                      local_208[0] = (Matrix<double,_3,_3,_0,_3,_3> *)
                                     (dVar6 * local_3d8.
                                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                              .m_storage.m_data.array[6] +
                                     dVar4 * local_3d8.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[3] +
                                     dVar1 * local_3d8.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[0]);
                      local_208[1] = (Matrix<double,_3,_3,_0,_3,_3> *)
                                     (dVar6 * local_3d8.
                                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                              .m_storage.m_data.array[7] +
                                     dVar4 * local_3d8.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[4] +
                                     dVar1 * local_3d8.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                             .m_storage.m_data.array[1]);
                      pp_Var2 = (this->super_DynamicalSystemFunctorBase).
                                _vptr_DynamicalSystemFunctorBase;
                      local_1f8 = local_3d8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[8] *
                                  (local_1e8->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array[2] +
                                  local_3d8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[5] *
                                  (local_1e8->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array[1] +
                                  local_3d8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[2] *
                                  (local_1e8->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array[0];
                      local_1f0 = (Matrix<double,_3,_3,_0,_3,_3> *)local_328;
                      uVar16 = (ulong)((uint)((ulong)(pp_Var2 + lVar11) >> 3) & 1);
                      if (((ulong)(pp_Var2 + lVar11) & 7) != 0) {
                        uVar16 = 3;
                      }
                      if (uVar16 != 0) {
                        uVar21 = 0;
                        do {
                          pp_Var2[IVar14 + uVar26 + uVar21] =
                               (_func_int *)
                               (((double)local_208[uVar21] + *(double *)(local_328 + uVar21 * 8)) -
                               pdVar12[uVar17 * 3 + uVar21]);
                          uVar21 = uVar21 + 1;
                        } while (uVar16 != uVar21);
                      }
                      uVar22 = (uint)uVar16 ^ 3;
                      uVar19 = (ulong)(uVar22 & 0xfffffffe);
                      uVar21 = uVar19 + uVar16;
                      if (1 < uVar22) {
                        uVar23 = uVar16;
                        do {
                          pMVar7 = local_208[uVar23 + 1];
                          dVar1 = *(double *)(local_328 + uVar23 * 8 + 8);
                          pdVar12 = (local_1e8->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array + uVar23;
                          dVar4 = pdVar12[1];
                          pp_Var2[IVar14 + uVar26 + uVar23] =
                               (_func_int *)
                               (((((Matrix<double,_3,_3,_0,_3,_3> *)local_328)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                 m_storage.m_data.array[uVar23] + (double)local_208[uVar23]) -
                               *pdVar12);
                          (pp_Var2 + IVar14 + uVar26 + uVar23)[1] =
                               (_func_int *)((dVar1 + (double)pMVar7) - dVar4);
                          uVar23 = uVar23 + 2;
                        } while (uVar23 < uVar21);
                      }
                      if ((uint)uVar21 < 3) {
                        lVar11 = uVar16 + uVar19 + -3;
                        do {
                          pp_Var2[IVar14 + uVar26 + lVar11 + 3] =
                               (_func_int *)
                               (((double)(&local_1f0)[lVar11] +
                                *(double *)(local_328 + lVar11 * 8 + 0x18)) -
                               local_1e8[1].
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[lVar11]);
                          lVar11 = lVar11 + 1;
                        } while (lVar11 != 0);
                      }
                      uVar17 = (ulong)((int)uVar17 + 1);
                      pdVar12 = x[0x17].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data;
                      uVar16 = (x[0x17].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows - (long)pdVar12 >> 3) * -0x5555555555555555;
                      uVar25 = uVar25 + 3;
                    } while (uVar17 <= uVar16 && uVar16 - uVar17 != 0);
                  }
                  free((void *)local_488.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[0]);
                  VVar31.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows = extraout_RDX;
                  VVar31.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data = (double *)this;
                  return (Vector)VVar31.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage;
                }
              }
LAB_0015578b:
              __function = 
              "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
              ;
              goto LAB_001557b7;
            }
          }
        }
      }
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001557b7:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector StableIMUFixedContactDynamicalSystem::measureDynamics(const Vector & x, const Vector & u, TimeIndex k)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  Vector3 accelerationFlex(x.segment(indexes::linAcc, 3));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  Vector3 angularAccelerationFlex(x.segment(indexes::angAcc, 3));

  Quaternion qFlex(computeQuaternion_(orientationFlexV));
  Matrix3 rFlex(qFlex.toRotationMatrix());

  assertInputVector_(u);

  Vector3 positionControl(u.segment(indexes::pos, 3));
  Vector3 velocityControl(u.segment(indexes::linVel, 3));
  Vector3 accelerationControl(u.segment(indexes::linAcc, 3));

  Vector3 orientationControlV(u.segment(indexes::ori, 3));
  Vector3 angularVelocityControl(u.segment(indexes::angVel, 3));

  Quaternion qControl(computeQuaternion_(orientationControlV));

  Quaternion q = qFlex * qControl;

  Vector3 acceleration(
      (kine::skewSymmetric(angularAccelerationFlex) + tools::square(kine::skewSymmetric(angularVelocityFlex))) * rFlex
          * positionControl
      + 2 * kine::skewSymmetric(angularVelocityFlex) * rFlex * velocityControl + accelerationFlex
      + rFlex * accelerationControl);

  Vector3 angularVelocity(angularVelocityFlex + rFlex * angularVelocityControl);

  Vector v(Vector::Zero(10, 1));

  v.head<4>() = q.coeffs();

  v.segment(4, 3) = acceleration;
  v.tail(3) = angularVelocity;

  sensor_.setState(v, k);

  Vector y(Matrix::Zero(measurementSize_, 1));

  y.head(sensor_.getMeasurementSize()) = sensor_.getMeasurements();

  for(unsigned i = 0; i < contactPositions_.size(); ++i)
  {
    y.segment(sensor_.getMeasurementSize() + i * 3, 3) =
        rFlex * contactPositions_[i] + positionFlex - contactPositions_[i];
  }

  return y;
}